

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_BT_x86(Mat *A,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int N,int K,
                     int transA,int output_transpose,int constant_TILE_M,int constant_TILE_N,
                     int constant_TILE_K,int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  long *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  long in_stack_00000040;
  bool k_end;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat ATX;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int M;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_00000a70;
  int in_stack_00000a74;
  int in_stack_00000a78;
  int in_stack_00000a7c;
  Mat *in_stack_00000a80;
  Mat *in_stack_00000a88;
  int in_stack_00002640;
  int in_stack_00002644;
  int in_stack_00002648;
  int in_stack_0000264c;
  Mat *in_stack_00002650;
  Mat *in_stack_00002658;
  undefined1 in_stack_00002beb;
  int in_stack_00002bec;
  Mat *in_stack_00002bf0;
  Mat *in_stack_00002bf8;
  Mat *in_stack_00002c00;
  Mat *in_stack_00002c08;
  Mat *in_stack_00002c10;
  undefined4 in_stack_fffffffffffff754;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  int in_stack_fffffffffffff764;
  int in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  Mat *in_stack_fffffffffffff770;
  int in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a4;
  undefined8 in_stack_fffffffffffff7a8;
  void **ppvVar2;
  undefined8 in_stack_fffffffffffff7b0;
  Mat *pMVar3;
  bool local_841;
  int *in_stack_fffffffffffff7c0;
  int *in_stack_fffffffffffff7c8;
  int *in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d8;
  void **local_7e0;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_76c;
  int local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined8 local_750;
  undefined4 local_748;
  Allocator *local_740;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined8 local_720;
  Mat local_718;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined4 local_6b8;
  long *local_6b0;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined8 local_690;
  void *local_688;
  int *local_680;
  long local_678;
  undefined4 local_670;
  long *local_668;
  undefined4 local_660;
  int local_65c;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  long local_648;
  int local_63c;
  int local_638;
  int local_634;
  void **local_630;
  int local_624;
  int local_620;
  int local_61c;
  void *local_618;
  int *local_610;
  ulong local_608;
  undefined4 local_600;
  long *local_5f8;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  ulong local_5d8;
  void *local_5d0;
  int *local_5c8;
  void *local_5c0;
  undefined4 local_5b8;
  long *local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  void *local_590;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  void *local_560;
  int *local_558;
  ulong local_550;
  undefined4 local_548;
  long *local_540;
  int local_538;
  int local_534;
  int local_530;
  undefined4 local_52c;
  undefined4 local_528;
  long local_520;
  void *local_518;
  int *local_510;
  long local_508;
  undefined4 local_500;
  long *local_4f8;
  undefined4 local_4f0;
  int local_4ec;
  int local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  long local_4d8;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  void **local_4a8;
  long *local_4a0;
  long local_498;
  void **local_490;
  void **local_488;
  void **local_480;
  undefined8 *local_470;
  undefined8 *local_460;
  Mat *local_450;
  void **local_440;
  void **local_430;
  void **local_420;
  void **local_410;
  undefined1 local_3fd;
  int local_3fc;
  void **local_3f8;
  undefined8 *local_3f0;
  undefined1 local_3dd;
  int local_3dc;
  void **local_3d8;
  void **local_3d0;
  undefined4 local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  void **local_3b0;
  int local_378;
  undefined4 local_374;
  void **local_370;
  int local_358;
  undefined4 local_354;
  void **local_350;
  int local_338;
  undefined4 local_334;
  void **local_330;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  int local_298;
  undefined4 local_294;
  void **local_290;
  void **local_280;
  void **local_278;
  void **local_270;
  int local_268;
  undefined4 local_264;
  void **local_260;
  long *local_258;
  undefined4 local_24c;
  ulong local_248;
  void *local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  void **local_228;
  long *local_220;
  undefined4 local_214;
  long local_210;
  void *local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  long *local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  void *local_1b0;
  undefined4 local_1a8;
  int local_1a4;
  void **local_1a0;
  void *local_198;
  void *local_190;
  void *local_160;
  void *local_150;
  void *local_140;
  void *local_130;
  void *local_120;
  undefined1 local_fd;
  int local_fc;
  undefined8 *local_f0;
  Allocator *local_d0;
  int local_c4;
  size_t local_c0;
  long local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  long local_90;
  undefined4 local_80;
  int local_7c;
  undefined8 *local_78;
  Mat *local_70;
  Allocator *local_68;
  int local_5c;
  size_t local_58;
  void *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Mat *in_stack_ffffffffffffffc0;
  Mat *A_00;
  
  if (in_stack_00000010 == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_76c = *(int *)(in_RDI + 0x38);
    }
    else {
      local_76c = *(int *)(in_RDI + 0x30);
    }
    local_768 = local_76c * *(int *)(in_RDI + 0x18);
  }
  else {
    local_768 = *(int *)(in_RDI + 0x2c);
  }
  local_4bc = local_768;
  local_4b8 = in_R9D;
  local_4b4 = in_R8D;
  local_4a8 = in_RDX;
  local_4a0 = in_RSI;
  local_498 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(int)in_stack_fffffffffffff7b0,
             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8,
             in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0,in_stack_fffffffffffff7c0,
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8);
  local_4cc = (local_4bc + local_4c0 + -1) / local_4c0;
  A_00 = *(Mat **)(in_stack_00000040 + 0x10);
  local_518 = (void *)0x0;
  local_510 = (int *)0x0;
  local_508 = 0;
  local_500 = 0;
  local_4f8 = (long *)0x0;
  local_4f0 = 0;
  local_4ec = 0;
  local_4e8 = 0;
  local_4e4 = 0;
  local_4e0 = 0;
  local_4d8 = 0;
  Mat::create(in_stack_fffffffffffff770,in_stack_fffffffffffff76c,in_stack_fffffffffffff768,
              in_stack_fffffffffffff764,
              CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
              (Allocator *)CONCAT44(in_stack_fffffffffffff754,in_stack_00000038));
  local_490 = &local_560;
  local_560 = (void *)0x0;
  local_558 = (int *)0x0;
  local_550 = 0;
  local_548 = 0;
  local_540 = (long *)0x0;
  local_538 = 0;
  local_534 = 0;
  local_530 = 0;
  local_52c = 0;
  local_528 = 0;
  local_520 = 0;
  if (((local_4c8 < in_stack_00000008) || (local_4b4 == 3)) || (in_stack_00000018 != 0)) {
    Mat::create(in_stack_fffffffffffff770,in_stack_fffffffffffff76c,in_stack_fffffffffffff768,
                in_stack_fffffffffffff764,
                CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                (Allocator *)CONCAT44(in_stack_fffffffffffff754,in_stack_00000038));
  }
  for (local_570 = 0; local_570 < local_4cc; local_570 = local_570 + 1) {
    local_574 = local_570 * local_4c0;
    if (in_stack_00000010 == 0) {
      if (*(int *)(local_498 + 0x28) == 3) {
        local_788 = *(int *)(local_498 + 0x38);
      }
      else {
        local_788 = *(int *)(local_498 + 0x30);
      }
      local_784 = local_788 * *(int *)(local_498 + 0x18);
    }
    else {
      local_784 = *(int *)(local_498 + 0x2c);
    }
    local_578 = local_784;
    if (in_stack_00000010 == 0) {
      local_790 = *(int *)(local_498 + 0x2c);
    }
    else {
      if (*(int *)(local_498 + 0x28) == 3) {
        local_78c = *(int *)(local_498 + 0x38);
      }
      else {
        local_78c = *(int *)(local_498 + 0x30);
      }
      local_790 = local_78c * *(int *)(local_498 + 0x18);
    }
    local_57c = local_790;
    local_584 = local_784 - local_574;
    piVar1 = std::min<int>(&local_584,&local_4c0);
    local_580 = *piVar1;
    local_488 = &local_5d0;
    local_5d0 = (void *)0x0;
    local_5c8 = (int *)0x0;
    local_5c0 = (void *)0x0;
    local_5b8 = 0;
    local_5b0 = (long *)0x0;
    local_5a8 = 0;
    local_5a4 = 0;
    local_5a0 = 0;
    local_59c = 0;
    local_598 = 0;
    local_590 = (void *)0x0;
    if (((local_4c8 < local_57c) || (local_4b4 == 3)) || (in_stack_00000018 != 0)) {
      local_3dc = get_omp_thread_num();
      local_3d0 = &local_618;
      local_3d8 = &local_560;
      local_240 = (void *)((long)local_560 + local_520 * local_3dc * local_550);
      local_228 = &local_618;
      local_618 = local_240;
      local_610 = (int *)0x0;
      local_608 = local_550;
      local_600 = local_548;
      local_5f8 = local_540;
      local_5ec = local_534;
      local_5e8 = local_530;
      local_5e4 = 1;
      local_5e0 = local_52c;
      local_1d0 = (long)local_534 * (long)local_530 * local_550;
      local_5d8 = (local_1d0 + 0xfU & 0xfffffffffffffff0) / local_550;
      local_5f0 = local_538 + -1;
      if (local_538 == 4) {
        local_5d8 = (long)local_534 * (long)local_530;
      }
      local_1d4 = 0x10;
      local_22c = local_534;
      local_230 = local_530;
      local_234 = local_52c;
      local_248 = local_550;
      local_24c = local_548;
      local_258 = local_540;
      local_3dd = 1;
      local_280 = &local_618;
      local_278 = &local_5d0;
      if (&local_5d0 != local_280) {
        local_260 = &local_5d0;
        if (local_5c8 != (int *)0x0) {
          local_264 = 0xffffffff;
          LOCK();
          local_268 = *local_5c8;
          *local_5c8 = *local_5c8 + -1;
          UNLOCK();
          if (local_268 == 1) {
            if (local_5b0 == (long *)0x0) {
              local_198 = local_5d0;
              if (local_5d0 != (void *)0x0) {
                free(local_5d0);
              }
            }
            else {
              (**(code **)(*local_5b0 + 0x18))(local_5b0,local_5d0);
            }
          }
        }
        local_5d0 = (void *)0x0;
        local_5c0 = (void *)0x0;
        local_5b8 = 0;
        local_5a8 = 0;
        local_5a4 = 0;
        local_5a0 = 0;
        local_59c = 0;
        local_598 = 0;
        local_590 = (void *)0x0;
        local_5c8 = (int *)0x0;
        local_5d0 = *local_280;
        local_5c8 = (int *)local_280[1];
        local_5c0 = local_280[2];
        local_5b8 = *(undefined4 *)(local_280 + 3);
        local_5b0 = (long *)local_280[4];
        local_5a8 = *(undefined4 *)(local_280 + 5);
        local_5a4 = *(undefined4 *)((long)local_280 + 0x2c);
        local_5a0 = *(undefined4 *)(local_280 + 6);
        local_59c = *(undefined4 *)((long)local_280 + 0x34);
        local_598 = *(undefined4 *)(local_280 + 7);
        local_590 = local_280[8];
      }
      local_480 = &local_618;
      local_290 = local_480;
      local_270 = &local_5d0;
      if (local_610 != (int *)0x0) {
        local_294 = 0xffffffff;
        LOCK();
        local_298 = *local_610;
        *local_610 = *local_610 + -1;
        UNLOCK();
        if (local_298 == 1) {
          if (local_5f8 == (long *)0x0) {
            local_190 = local_618;
            if (local_618 != (void *)0x0) {
              free(local_618);
            }
          }
          else {
            (**(code **)(*local_5f8 + 0x18))(local_5f8,local_618);
          }
        }
      }
      local_618 = (void *)0x0;
      local_608 = 0;
      local_600 = 0;
      local_5f0 = 0;
      local_5ec = 0;
      local_5e8 = 0;
      local_5e4 = 0;
      local_5e0 = 0;
      local_5d8 = 0;
      local_610 = (int *)0x0;
    }
    for (local_61c = 0; local_61c < local_4b8; local_61c = local_4c4 + local_61c) {
      local_624 = local_4b8 - local_61c;
      piVar1 = std::min<int>(&local_624,&local_4c4);
      local_620 = *piVar1;
      if (local_4b4 == 3) {
        pack_A_tile(A_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                    in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                    (int)in_stack_ffffffffffffffb0);
      }
      if (local_4b4 == 3) {
        local_7e0 = &local_5d0;
      }
      else {
        local_7e0 = local_4a8;
      }
      local_630 = local_7e0;
      for (local_634 = 0; local_634 < local_57c; local_634 = local_4c8 + local_634) {
        local_63c = local_57c - local_634;
        piVar1 = std::min<int>(&local_63c,&local_4c8);
        local_638 = *piVar1;
        local_3fc = get_omp_thread_num();
        local_3f0 = &local_6d0;
        local_3f8 = &local_518;
        local_208 = (void *)((long)local_518 + local_4d8 * local_3fc * local_508);
        local_1f0 = &local_6d0;
        local_1e0 = (long)local_4ec * (long)local_4e8 * local_508;
        local_3bc = local_634 / local_4c8;
        local_3b0 = &local_688;
        local_3b8 = &local_6d0;
        local_1b0 = (void *)((long)local_208 + (long)local_4ec * (long)local_3bc * local_508);
        local_1a0 = &local_688;
        local_648 = (long)local_4ec;
        local_470 = &local_6d0;
        local_fc = local_61c / local_4c4;
        local_f0 = &local_760;
        local_a4 = *(int *)((long)local_4a0 + 0x2c);
        local_a8 = (int)local_4a0[6];
        local_ac = *(undefined4 *)((long)local_4a0 + 0x34);
        local_b8 = *local_4a0 + local_4a0[8] * (long)local_fc * local_4a0[2];
        local_c0 = local_4a0[2];
        local_c4 = (int)local_4a0[3];
        local_d0 = (Allocator *)local_4a0[4];
        local_a0 = &local_760;
        local_90 = (long)local_a4 * (long)local_a8 * local_c0;
        local_7c = local_634 / local_4c8;
        local_70 = &local_718;
        local_78 = &local_760;
        in_stack_ffffffffffffffb0 = (void *)(local_b8 + (long)local_a4 * (long)local_7c * local_c0);
        in_stack_ffffffffffffffc0 = &local_718;
        local_718.cstep = (size_t)local_a4;
        local_460 = &local_760;
        local_650 = 1;
        local_654 = 1;
        local_658 = 1;
        local_65c = local_4ec;
        local_660 = 2;
        local_668 = local_4f8;
        local_670 = local_500;
        local_678 = local_508;
        local_680 = (int *)0x0;
        local_698 = 0;
        local_69c = 0;
        local_6a0 = 0;
        local_6a4 = 0;
        local_6b0 = local_4f8;
        local_6b8 = 0;
        local_6c0 = 0;
        local_6c8 = 0;
        local_6d0 = 0;
        local_718.c = 1;
        local_718.d = 1;
        local_718.h = 1;
        local_718.dims = 2;
        local_718.refcount = (int *)0x0;
        in_stack_ffffffffffffffb8 = 1;
        local_80 = 1;
        local_94 = 0x10;
        local_fd = 1;
        local_1a4 = local_4ec;
        local_1a8 = 1;
        local_1b8 = local_508;
        local_1bc = local_500;
        local_1c8 = local_4f8;
        local_1e4 = 0x10;
        local_1f4 = local_4ec;
        local_1f8 = local_4e8;
        local_1fc = local_4e4;
        local_210 = local_508;
        local_214 = local_500;
        local_220 = local_4f8;
        local_3c0 = 1;
        local_3fd = 1;
        local_690 = 0;
        local_6a8 = 0;
        local_760 = 0;
        local_750 = 0;
        local_748 = 0;
        local_738 = 0;
        local_734 = 0;
        local_730 = 0;
        local_72c = 0;
        local_728 = 0;
        local_720 = 0;
        local_758 = 0;
        local_2d0 = local_460;
        local_2b0 = local_470;
        local_68 = local_d0;
        local_5c = local_c4;
        local_58 = local_c0;
        in_stack_ffffffffffffffbc = local_a4;
        local_740 = local_d0;
        local_718.data = in_stack_ffffffffffffffb0;
        local_718.elemsize = local_c0;
        local_718.elempack = local_c4;
        local_718.allocator = local_d0;
        local_718.w = local_a4;
        local_688 = local_1b0;
        if (local_61c == 0) {
          if (in_stack_00000010 == 0) {
            pack_A_tile(A_00,in_stack_ffffffffffffffc0,local_a4,1,
                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
          }
          else {
            transpose_pack_A_tile
                      (in_stack_00000a88,in_stack_00000a80,in_stack_00000a7c,in_stack_00000a78,
                       in_stack_00000a74,in_stack_00000a70);
          }
        }
        local_841 = in_stack_00000018 == 0 && local_57c <= local_634 + local_4c8;
        gemm_transB_packed_tile
                  (in_stack_00002c10,in_stack_00002c08,in_stack_00002c00,in_stack_00002bf8,
                   in_stack_00002bf0,in_stack_00002bec,local_580,local_61c,local_620,local_634,
                   local_638,(uint)local_841,(bool)in_stack_00002beb);
        pMVar3 = &local_718;
        local_450 = pMVar3;
        local_2f0 = pMVar3;
        if (local_718.refcount != (int *)0x0) {
          local_2f4 = 0xffffffff;
          LOCK();
          local_2f8 = *local_718.refcount;
          *local_718.refcount = *local_718.refcount + -1;
          UNLOCK();
          if (local_2f8 == 1) {
            if (local_718.allocator == (Allocator *)0x0) {
              local_160 = local_718.data;
              if (local_718.data != (void *)0x0) {
                free(local_718.data);
              }
            }
            else {
              (*(local_718.allocator)->_vptr_Allocator[3])(local_718.allocator,local_718.data);
            }
          }
        }
        pMVar3->data = (void *)0x0;
        pMVar3->elemsize = 0;
        pMVar3->elempack = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->cstep = 0;
        pMVar3->refcount = (int *)0x0;
        ppvVar2 = &local_688;
        local_440 = ppvVar2;
        local_310 = ppvVar2;
        if (local_680 != (int *)0x0) {
          local_314 = 0xffffffff;
          LOCK();
          local_318 = *local_680;
          *local_680 = *local_680 + -1;
          UNLOCK();
          if (local_318 == 1) {
            if (local_668 == (long *)0x0) {
              local_150 = local_688;
              if (local_688 != (void *)0x0) {
                free(local_688);
              }
            }
            else {
              (**(code **)(*local_668 + 0x18))(local_668,local_688);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
      }
      if (in_stack_00000018 != 0) {
        transpose_unpack_output_tile
                  (in_stack_00002658,in_stack_00002650,in_stack_0000264c,in_stack_00002648,
                   in_stack_00002644,in_stack_00002640);
      }
    }
    local_430 = &local_5d0;
    local_330 = local_430;
    if (local_5c8 != (int *)0x0) {
      local_334 = 0xffffffff;
      LOCK();
      local_338 = *local_5c8;
      *local_5c8 = *local_5c8 + -1;
      UNLOCK();
      if (local_338 == 1) {
        if (local_5b0 == (long *)0x0) {
          local_140 = local_5d0;
          if (local_5d0 != (void *)0x0) {
            free(local_5d0);
          }
        }
        else {
          (**(code **)(*local_5b0 + 0x18))(local_5b0,local_5d0);
        }
      }
    }
    local_5d0 = (void *)0x0;
    local_5c0 = (void *)0x0;
    local_5b8 = 0;
    local_5a8 = 0;
    local_5a4 = 0;
    local_5a0 = 0;
    local_59c = 0;
    local_598 = 0;
    local_590 = (void *)0x0;
    local_5c8 = (int *)0x0;
  }
  local_420 = &local_560;
  local_350 = local_420;
  if (local_558 != (int *)0x0) {
    local_354 = 0xffffffff;
    LOCK();
    local_358 = *local_558;
    *local_558 = *local_558 + -1;
    UNLOCK();
    if (local_358 == 1) {
      if (local_540 == (long *)0x0) {
        local_130 = local_560;
        if (local_560 != (void *)0x0) {
          free(local_560);
        }
      }
      else {
        (**(code **)(*local_540 + 0x18))(local_540,local_560);
      }
    }
  }
  local_560 = (void *)0x0;
  local_550 = 0;
  local_548 = 0;
  local_538 = 0;
  local_534 = 0;
  local_530 = 0;
  local_52c = 0;
  local_528 = 0;
  local_520 = 0;
  local_558 = (int *)0x0;
  local_410 = &local_518;
  if (local_510 != (int *)0x0) {
    local_374 = 0xffffffff;
    LOCK();
    local_378 = *local_510;
    *local_510 = *local_510 + -1;
    UNLOCK();
    if (local_378 == 1) {
      local_370 = local_410;
      if (local_4f8 == (long *)0x0) {
        local_120 = local_518;
        if (local_518 != (void *)0x0) {
          free(local_518);
        }
      }
      else {
        (**(code **)(*local_4f8 + 0x18))(local_4f8,local_518);
      }
    }
  }
  return 0;
}

Assistant:

static int gemm_BT_x86(const Mat& A, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int N, int K, int transA, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}